

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflate(z_streamp strm,int flush)

{
  Bytef BVar1;
  uInt uVar2;
  deflate_state *s_00;
  ulg uVar3;
  Bytef *pBVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uLong uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  block_state local_7c;
  block_state local_78;
  block_state local_74;
  Bytef local_6c;
  Bytef local_64;
  block_state bstate;
  int val_1;
  ulg beg_2;
  ulg uStack_48;
  int val;
  ulg beg_1;
  uInt copy;
  uInt left;
  ulg beg;
  uInt level_flags;
  uInt header;
  deflate_state *s;
  int old_flush;
  int flush_local;
  z_streamp strm_local;
  
  iVar6 = deflateStateCheck(strm);
  if (((iVar6 == 0) && (flush < 6)) && (-1 < flush)) {
    s_00 = strm->state;
    if (((strm->next_out == (Bytef *)0x0) ||
        ((strm->avail_in != 0 && (strm->next_in == (Bytef *)0x0)))) ||
       ((s_00->status == 0x29a && (flush != 4)))) {
      strm->msg = "stream error";
      strm_local._4_4_ = 0xfffffffe;
    }
    else if (strm->avail_out == 0) {
      strm->msg = "buffer error";
      strm_local._4_4_ = 0xfffffffb;
    }
    else {
      iVar6 = s_00->last_flush;
      s_00->last_flush = flush;
      if (s_00->pending == 0) {
        if (strm->avail_in == 0) {
          iVar13 = 0;
          if (4 < flush) {
            iVar13 = 9;
          }
          iVar14 = 0;
          if (4 < iVar6) {
            iVar14 = 9;
          }
          if ((flush * 2 - iVar13 <= iVar6 * 2 - iVar14) && (flush != 4)) {
            strm->msg = "buffer error";
            return -5;
          }
        }
      }
      else {
        flush_pending(strm);
        if (strm->avail_out == 0) {
          s_00->last_flush = -1;
          return 0;
        }
      }
      if ((s_00->status == 0x29a) && (strm->avail_in != 0)) {
        strm->msg = "buffer error";
        strm_local._4_4_ = 0xfffffffb;
      }
      else {
        if (s_00->status == 0x2a) {
          if ((s_00->strategy < 2) && (1 < s_00->level)) {
            if (s_00->level < 6) {
              beg._0_4_ = 1;
            }
            else if (s_00->level == 6) {
              beg._0_4_ = 2;
            }
            else {
              beg._0_4_ = 3;
            }
          }
          else {
            beg._0_4_ = 0;
          }
          beg._4_4_ = (int)beg << 6 | ((s_00->w_bits - 8) * 0x10 + 8) * 0x100;
          if (s_00->strstart != 0) {
            beg._4_4_ = beg._4_4_ | 0x20;
          }
          putShortMSB(s_00,(0x1f - beg._4_4_ % 0x1f) + beg._4_4_);
          if (s_00->strstart != 0) {
            putShortMSB(s_00,(uInt)(strm->adler >> 0x10));
            putShortMSB(s_00,(uint)strm->adler & 0xffff);
          }
          uVar8 = adler32(0,(Bytef *)0x0,0);
          strm->adler = uVar8;
          s_00->status = 0x71;
          flush_pending(strm);
          if (s_00->pending != 0) {
            s_00->last_flush = -1;
            return 0;
          }
        }
        if (s_00->status == 0x39) {
          uVar8 = crc32(0,(uchar *)0x0,0);
          strm->adler = uVar8;
          uVar3 = s_00->pending;
          s_00->pending = uVar3 + 1;
          s_00->pending_buf[uVar3] = '\x1f';
          uVar3 = s_00->pending;
          s_00->pending = uVar3 + 1;
          s_00->pending_buf[uVar3] = 0x8b;
          uVar3 = s_00->pending;
          s_00->pending = uVar3 + 1;
          s_00->pending_buf[uVar3] = '\b';
          if (s_00->gzhead == (gz_headerp)0x0) {
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = '\0';
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = '\0';
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = '\0';
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = '\0';
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = '\0';
            if (s_00->level == 9) {
              local_64 = '\x02';
            }
            else {
              bVar5 = true;
              if (s_00->strategy < 2) {
                bVar5 = s_00->level < 2;
              }
              local_64 = '\0';
              if (bVar5) {
                local_64 = '\x04';
              }
            }
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = local_64;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = '\x03';
            s_00->status = 0x71;
            flush_pending(strm);
            if (s_00->pending != 0) {
              s_00->last_flush = -1;
              return 0;
            }
          }
          else {
            iVar6 = s_00->gzhead->text;
            cVar9 = '\0';
            if (s_00->gzhead->hcrc != 0) {
              cVar9 = '\x02';
            }
            cVar10 = '\x04';
            if (s_00->gzhead->extra == (Bytef *)0x0) {
              cVar10 = '\0';
            }
            cVar11 = '\b';
            if (s_00->gzhead->name == (Bytef *)0x0) {
              cVar11 = '\0';
            }
            cVar12 = '\x10';
            if (s_00->gzhead->comment == (Bytef *)0x0) {
              cVar12 = '\0';
            }
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (iVar6 != 0) + cVar9 + cVar10 + cVar11 + cVar12;
            uVar8 = s_00->gzhead->time;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)uVar8;
            uVar8 = s_00->gzhead->time;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 8);
            uVar8 = s_00->gzhead->time;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 0x10);
            uVar8 = s_00->gzhead->time;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 0x18);
            if (s_00->level == 9) {
              local_6c = '\x02';
            }
            else {
              bVar5 = true;
              if (s_00->strategy < 2) {
                bVar5 = s_00->level < 2;
              }
              local_6c = '\0';
              if (bVar5) {
                local_6c = '\x04';
              }
            }
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = local_6c;
            iVar6 = s_00->gzhead->os;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)iVar6;
            if (s_00->gzhead->extra != (Bytef *)0x0) {
              uVar2 = s_00->gzhead->extra_len;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)uVar2;
              uVar2 = s_00->gzhead->extra_len;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar2 >> 8);
            }
            if (s_00->gzhead->hcrc != 0) {
              uVar8 = crc32(strm->adler,s_00->pending_buf,(uInt)s_00->pending);
              strm->adler = uVar8;
            }
            s_00->gzindex = 0;
            s_00->status = 0x45;
          }
        }
        if (s_00->status == 0x45) {
          if (s_00->gzhead->extra != (Bytef *)0x0) {
            _copy = s_00->pending;
            for (beg_1._4_4_ = (s_00->gzhead->extra_len & 0xffff) - (int)s_00->gzindex;
                s_00->pending_buf_size < s_00->pending + (ulong)beg_1._4_4_;
                beg_1._4_4_ = beg_1._4_4_ - uVar7) {
              uVar7 = (int)s_00->pending_buf_size - (int)s_00->pending;
              memcpy(s_00->pending_buf + s_00->pending,s_00->gzhead->extra + s_00->gzindex,
                     (ulong)uVar7);
              s_00->pending = s_00->pending_buf_size;
              if ((s_00->gzhead->hcrc != 0) && (_copy < s_00->pending)) {
                uVar8 = crc32(strm->adler,s_00->pending_buf + _copy,(int)s_00->pending - (int)_copy)
                ;
                strm->adler = uVar8;
              }
              s_00->gzindex = (ulong)uVar7 + s_00->gzindex;
              flush_pending(strm);
              if (s_00->pending != 0) {
                s_00->last_flush = -1;
                return 0;
              }
              _copy = 0;
            }
            memcpy(s_00->pending_buf + s_00->pending,s_00->gzhead->extra + s_00->gzindex,
                   (ulong)beg_1._4_4_);
            s_00->pending = (ulong)beg_1._4_4_ + s_00->pending;
            if ((s_00->gzhead->hcrc != 0) && (_copy < s_00->pending)) {
              uVar8 = crc32(strm->adler,s_00->pending_buf + _copy,(int)s_00->pending - (int)_copy);
              strm->adler = uVar8;
            }
            s_00->gzindex = 0;
          }
          s_00->status = 0x49;
        }
        if (s_00->status == 0x49) {
          if (s_00->gzhead->name != (Bytef *)0x0) {
            uStack_48 = s_00->pending;
            do {
              if (s_00->pending == s_00->pending_buf_size) {
                if ((s_00->gzhead->hcrc != 0) && (uStack_48 < s_00->pending)) {
                  uVar8 = crc32(strm->adler,s_00->pending_buf + uStack_48,
                                (int)s_00->pending - (int)uStack_48);
                  strm->adler = uVar8;
                }
                flush_pending(strm);
                if (s_00->pending != 0) {
                  s_00->last_flush = -1;
                  return 0;
                }
                uStack_48 = 0;
              }
              pBVar4 = s_00->gzhead->name;
              uVar3 = s_00->gzindex;
              s_00->gzindex = uVar3 + 1;
              BVar1 = pBVar4[uVar3];
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = BVar1;
            } while (BVar1 != '\0');
            if ((s_00->gzhead->hcrc != 0) && (uStack_48 < s_00->pending)) {
              uVar8 = crc32(strm->adler,s_00->pending_buf + uStack_48,
                            (int)s_00->pending - (int)uStack_48);
              strm->adler = uVar8;
            }
            s_00->gzindex = 0;
          }
          s_00->status = 0x5b;
        }
        if (s_00->status == 0x5b) {
          if (s_00->gzhead->comment != (Bytef *)0x0) {
            _bstate = s_00->pending;
            do {
              if (s_00->pending == s_00->pending_buf_size) {
                if ((s_00->gzhead->hcrc != 0) && (_bstate < s_00->pending)) {
                  uVar8 = crc32(strm->adler,s_00->pending_buf + _bstate,
                                (int)s_00->pending - (int)_bstate);
                  strm->adler = uVar8;
                }
                flush_pending(strm);
                if (s_00->pending != 0) {
                  s_00->last_flush = -1;
                  return 0;
                }
                _bstate = 0;
              }
              pBVar4 = s_00->gzhead->comment;
              uVar3 = s_00->gzindex;
              s_00->gzindex = uVar3 + 1;
              BVar1 = pBVar4[uVar3];
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = BVar1;
            } while (BVar1 != '\0');
            if ((s_00->gzhead->hcrc != 0) && (_bstate < s_00->pending)) {
              uVar8 = crc32(strm->adler,s_00->pending_buf + _bstate,
                            (int)s_00->pending - (int)_bstate);
              strm->adler = uVar8;
            }
          }
          s_00->status = 0x67;
        }
        if (s_00->status == 0x67) {
          if (s_00->gzhead->hcrc != 0) {
            if ((s_00->pending_buf_size < s_00->pending + 2) &&
               (flush_pending(strm), s_00->pending != 0)) {
              s_00->last_flush = -1;
              return 0;
            }
            uVar8 = strm->adler;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)uVar8;
            uVar8 = strm->adler;
            uVar3 = s_00->pending;
            s_00->pending = uVar3 + 1;
            s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 8);
            uVar8 = crc32(0,(uchar *)0x0,0);
            strm->adler = uVar8;
          }
          s_00->status = 0x71;
          flush_pending(strm);
          if (s_00->pending != 0) {
            s_00->last_flush = -1;
            return 0;
          }
        }
        if (((strm->avail_in != 0) || (s_00->lookahead != 0)) ||
           ((flush != 0 && (s_00->status != 0x29a)))) {
          if (s_00->level == 0) {
            local_74 = deflate_stored(s_00,flush);
          }
          else {
            if (s_00->strategy == 2) {
              local_78 = deflate_huff(s_00,flush);
            }
            else {
              if (s_00->strategy == 3) {
                local_7c = deflate_rle(s_00,flush);
              }
              else {
                local_7c = (*configuration_table[s_00->level].func)(s_00,flush);
              }
              local_78 = local_7c;
            }
            local_74 = local_78;
          }
          if ((local_74 == finish_started) || (local_74 == finish_done)) {
            s_00->status = 0x29a;
          }
          if ((local_74 == need_more) || (local_74 == finish_started)) {
            if (strm->avail_out == 0) {
              s_00->last_flush = -1;
            }
            return 0;
          }
          if (local_74 == block_done) {
            if (flush == 1) {
              _tr_align(s_00);
            }
            else if ((flush != 5) && (_tr_stored_block(s_00,(charf *)0x0,0,0), flush == 3)) {
              s_00->head[s_00->hash_size - 1] = 0;
              memset(s_00->head,0,(ulong)(s_00->hash_size - 1) << 1);
              if (s_00->lookahead == 0) {
                s_00->strstart = 0;
                s_00->block_start = 0;
                s_00->insert = 0;
              }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s_00->last_flush = -1;
              return 0;
            }
          }
        }
        if (flush == 4) {
          if (s_00->wrap < 1) {
            strm_local._4_4_ = 1;
          }
          else {
            if (s_00->wrap == 2) {
              uVar8 = strm->adler;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)uVar8;
              uVar8 = strm->adler;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 8);
              uVar8 = strm->adler;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 0x10);
              uVar8 = strm->adler;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 0x18);
              uVar8 = strm->total_in;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)uVar8;
              uVar8 = strm->total_in;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 8);
              uVar8 = strm->total_in;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 0x10);
              uVar8 = strm->total_in;
              uVar3 = s_00->pending;
              s_00->pending = uVar3 + 1;
              s_00->pending_buf[uVar3] = (Bytef)(uVar8 >> 0x18);
            }
            else {
              putShortMSB(s_00,(uInt)(strm->adler >> 0x10));
              putShortMSB(s_00,(uint)strm->adler & 0xffff);
            }
            flush_pending(strm);
            if (0 < s_00->wrap) {
              s_00->wrap = -s_00->wrap;
            }
            strm_local._4_4_ = (uint)(s_00->pending == 0);
          }
        }
        else {
          strm_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    strm_local._4_4_ = 0xfffffffe;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (deflateStateCheck(strm) || flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->avail_in != 0 && strm->next_in == Z_NULL) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && RANK(flush) <= RANK(old_flush) &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Write the header */
    if (s->status == INIT_STATE) {
        /* zlib header */
        uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
        uInt level_flags;

        if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
            level_flags = 0;
        else if (s->level < 6)
            level_flags = 1;
        else if (s->level == 6)
            level_flags = 2;
        else
            level_flags = 3;
        header |= (level_flags << 6);
        if (s->strstart != 0) header |= PRESET_DICT;
        header += 31 - (header % 31);

        putShortMSB(s, header);

        /* Save the adler32 of the preset dictionary: */
        if (s->strstart != 0) {
            putShortMSB(s, (uInt)(strm->adler >> 16));
            putShortMSB(s, (uInt)(strm->adler & 0xffff));
        }
        strm->adler = adler32(0L, Z_NULL, 0);
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#ifdef GZIP
    if (s->status == GZIP_STATE) {
        /* gzip header */
        strm->adler = crc32(0L, Z_NULL, 0);
        put_byte(s, 31);
        put_byte(s, 139);
        put_byte(s, 8);
        if (s->gzhead == Z_NULL) {
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, OS_CODE);
            s->status = BUSY_STATE;

            /* Compression must start with an empty pending buffer */
            flush_pending(strm);
            if (s->pending != 0) {
                s->last_flush = -1;
                return Z_OK;
            }
        }
        else {
            put_byte(s, (s->gzhead->text ? 1 : 0) +
                     (s->gzhead->hcrc ? 2 : 0) +
                     (s->gzhead->extra == Z_NULL ? 0 : 4) +
                     (s->gzhead->name == Z_NULL ? 0 : 8) +
                     (s->gzhead->comment == Z_NULL ? 0 : 16)
                     );
            put_byte(s, (Byte)(s->gzhead->time & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, s->gzhead->os & 0xff);
            if (s->gzhead->extra != Z_NULL) {
                put_byte(s, s->gzhead->extra_len & 0xff);
                put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
            }
            if (s->gzhead->hcrc)
                strm->adler = crc32(strm->adler, s->pending_buf,
                                    s->pending);
            s->gzindex = 0;
            s->status = EXTRA_STATE;
        }
    }
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            uInt left = (s->gzhead->extra_len & 0xffff) - s->gzindex;
            while (s->pending + left > s->pending_buf_size) {
                uInt copy = s->pending_buf_size - s->pending;
                zmemcpy(s->pending_buf + s->pending,
                        s->gzhead->extra + s->gzindex, copy);
                s->pending = s->pending_buf_size;
                HCRC_UPDATE(beg);
                s->gzindex += copy;
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
                beg = 0;
                left -= copy;
            }
            zmemcpy(s->pending_buf + s->pending,
                    s->gzhead->extra + s->gzindex, left);
            s->pending += left;
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
        }
        s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size) {
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
            }
            put_byte(s, (Byte)(strm->adler & 0xff));
            put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
            strm->adler = crc32(0L, Z_NULL, 0);
        }
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#endif

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->level == 0 ? deflate_stored(s, flush) :
                 s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                 s->strategy == Z_RLE ? deflate_rle(s, flush) :
                 (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                        s->insert = 0;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}